

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O1

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::
     builder_move_assign_before_finish_test(void)

{
  FlatBufferBuilder *builder;
  bool val;
  Offset<MyGame::Example::Monster> root;
  GrpcLikeMessageBuilder src;
  GrpcLikeMessageBuilder dst;
  string local_158;
  GrpcLikeMessageBuilder local_138;
  GrpcLikeMessageBuilder local_b0;
  
  local_138.super_AllocatorMember.member_allocator_.super_Allocator._vptr_Allocator =
       (DefaultAllocator)&PTR__Allocator_00200ce8;
  local_138.super_FlatBufferBuilder.buf_.allocator_ = (Allocator *)&local_138;
  local_138.super_FlatBufferBuilder.buf_.own_allocator_ = false;
  local_138.super_FlatBufferBuilder.buf_.initial_size_ = 0x400;
  local_138.super_FlatBufferBuilder.buf_.max_size_ = 0x7fffffff;
  local_138.super_FlatBufferBuilder.buf_.buffer_minalign_ = 8;
  local_138.super_FlatBufferBuilder.buf_.reserved_ = 0;
  local_138.super_FlatBufferBuilder.buf_.size_ = 0;
  local_138.super_FlatBufferBuilder.length_of_64_bit_region_ = 0;
  local_138.super_FlatBufferBuilder.nested = false;
  local_138.super_FlatBufferBuilder.finished = false;
  local_138.super_FlatBufferBuilder.buf_.buf_ = (uint8_t *)0x0;
  local_138.super_FlatBufferBuilder.buf_.cur_._0_6_ = 0;
  local_138.super_FlatBufferBuilder.buf_.cur_._6_2_ = 0;
  local_138.super_FlatBufferBuilder.buf_.scratch_._0_6_ = 0;
  local_138.super_FlatBufferBuilder._78_8_ = 0;
  local_138.super_FlatBufferBuilder.minalign_ = 1;
  local_138.super_FlatBufferBuilder.force_defaults_ = false;
  local_138.super_FlatBufferBuilder.dedup_vtables_ = true;
  local_138.super_FlatBufferBuilder.string_pool = (StringOffsetMap *)0x0;
  root = populate1(&local_138.super_FlatBufferBuilder);
  builder = &local_b0.super_FlatBufferBuilder;
  local_b0.super_AllocatorMember.member_allocator_.super_Allocator._vptr_Allocator =
       (DefaultAllocator)&PTR__Allocator_00200ce8;
  local_b0.super_FlatBufferBuilder.buf_.allocator_ = (Allocator *)&local_b0;
  local_b0.super_FlatBufferBuilder.buf_.own_allocator_ = false;
  local_b0.super_FlatBufferBuilder.buf_.initial_size_ = 0x400;
  local_b0.super_FlatBufferBuilder.buf_.max_size_ = 0x7fffffff;
  local_b0.super_FlatBufferBuilder.buf_.buffer_minalign_ = 8;
  local_b0.super_FlatBufferBuilder.buf_.reserved_ = 0;
  local_b0.super_FlatBufferBuilder.buf_.size_ = 0;
  local_b0.super_FlatBufferBuilder.length_of_64_bit_region_ = 0;
  local_b0.super_FlatBufferBuilder.nested = false;
  local_b0.super_FlatBufferBuilder.finished = false;
  local_b0.super_FlatBufferBuilder.buf_.buf_ = (uint8_t *)0x0;
  local_b0.super_FlatBufferBuilder.buf_.cur_._0_6_ = 0;
  local_b0.super_FlatBufferBuilder.buf_.cur_._6_2_ = 0;
  local_b0.super_FlatBufferBuilder.buf_.scratch_._0_6_ = 0;
  local_b0.super_FlatBufferBuilder._78_8_ = 0;
  local_b0.super_FlatBufferBuilder.minalign_ = 1;
  local_b0.super_FlatBufferBuilder.force_defaults_ = false;
  local_b0.super_FlatBufferBuilder.dedup_vtables_ = true;
  local_b0.super_FlatBufferBuilder.string_pool = (StringOffsetMap *)0x0;
  populate2(builder);
  GrpcLikeMessageBuilder::operator=(&local_b0,&local_138);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish(builder,root.o,(char *)0x0,false);
  local_158.field_2._M_allocated_capacity = 0x6d65647265627943;
  local_158.field_2._8_2_ = 0x6e6f;
  local_158._M_string_length = 10;
  local_158.field_2._M_local_buf[10] = '\0';
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  val = release_n_verify(builder,&local_158,Color_Red);
  TestEq<bool,bool>(true,val,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0x7f,
                    "static void BuilderTests<GrpcLikeMessageBuilder>::builder_move_assign_before_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                   );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  TestEq<unsigned_int,int>
            (local_138.super_FlatBufferBuilder.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x80,
             "static void BuilderTests<GrpcLikeMessageBuilder>::builder_move_assign_before_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(builder);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            (&local_138.super_FlatBufferBuilder);
  return;
}

Assistant:

inline void m1_color_check() {
  // Ensure that all compilation units see the same monster_test_generated.h.
  extern void CheckTestGeneratedIsValid(const MyGame::Example::Color&);
  CheckTestGeneratedIsValid(m1_color());
}